

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphIO.cpp
# Opt level: O1

ErrorCode Escape::loadGraph(char *path,Graph *graph,int undirected,IOFormat fmt)

{
  VertexIdx *pVVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  ulong uVar4;
  VertexIdx *pVVar5;
  long lVar6;
  ErrorCode EVar7;
  bool bVar8;
  int64_t i1;
  char line [1024];
  long local_458;
  int local_44c;
  VertexIdx local_448;
  ulong local_440;
  char local_438;
  char local_437 [1031];
  
  EVar7 = ecUnsupportedFormat;
  if (fmt == escape) {
    __stream = fopen(path,"r");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"could not open file %s\n",path);
      EVar7 = ecInvalidInput;
    }
    else {
      graph->nVertices = 0;
      pcVar3 = fgets(&local_438,0x400,__stream);
      EVar7 = ecNone;
      if (pcVar3 == (char *)0x0) {
        lVar6 = 0;
      }
      else {
        local_440 = (ulong)(undirected != 0);
        lVar6 = 0;
        local_44c = undirected;
        do {
          if (local_438 != 0x23) {
            bVar8 = local_438 == '\0';
            if (bVar8) {
LAB_001045c5:
              if (bVar8) goto LAB_001045c9;
            }
            else {
              iVar2 = isspace((int)local_438);
              if (iVar2 != 0) {
                pcVar3 = local_437;
                do {
                  bVar8 = *pcVar3 == '\0';
                  if (bVar8) goto LAB_001045c5;
                  iVar2 = isspace((int)*pcVar3);
                  pcVar3 = pcVar3 + 1;
                } while (iVar2 != 0);
              }
            }
            __isoc99_sscanf(&local_438,"%lld%lld",&local_448,&local_458);
            if (graph->nVertices == 0) {
              graph->nVertices = local_448;
              uVar4 = local_458 << ((byte)local_440 & 0x3f);
              graph->nEdges = uVar4;
              uVar4 = -(ulong)(uVar4 >> 0x3d != 0) | uVar4 << 3;
              pVVar5 = (VertexIdx *)operator_new__(uVar4);
              graph->srcs = pVVar5;
              pVVar5 = (VertexIdx *)operator_new__(uVar4);
              graph->dsts = pVVar5;
            }
            else {
              pVVar5 = graph->srcs;
              pVVar5[lVar6] = local_448;
              pVVar1 = graph->dsts;
              pVVar1[lVar6] = local_458;
              if (local_44c == 0) {
                lVar6 = lVar6 + 1;
              }
              else {
                pVVar5[lVar6 + 1] = local_458;
                pVVar1[lVar6 + 1] = local_448;
                lVar6 = lVar6 + 2;
              }
            }
          }
LAB_001045c9:
          pcVar3 = fgets(&local_438,0x400,__stream);
        } while (pcVar3 != (char *)0x0);
      }
      fclose(__stream);
      if (lVar6 < graph->nEdges) {
        fprintf(_stderr,"expected %lld edges, only got %lld\n",graph->nEdges,lVar6);
        EVar7 = ecIOError;
      }
    }
  }
  return EVar7;
}

Assistant:

ErrorCode Escape::loadGraph(const char *path, Graph &graph, int undirected, IOFormat fmt) {
    switch (fmt) {
        case IOFormat::escape:
            return loadGraph_Escape(path, graph, undirected);
        default:
            return ecUnsupportedFormat;
    }
}